

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

string * __thiscall
booster::log::sinks::format_plain_text_message_abi_cxx11_
          (string *__return_storage_ptr__,sinks *this,message *msg)

{
  long lVar1;
  time_put *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  ptime pVar5;
  locale local_200;
  string local_1f8;
  ptime local_1d8;
  tm formatted;
  ostringstream ss;
  locale alStack_c0 [3];
  long alStack_a8 [18];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::locale::classic();
  std::ios::imbue(&local_200);
  std::locale::~locale(&local_200);
  pVar5 = ptime::now();
  local_1d8.sec = pVar5.sec;
  local_1d8.nsec = pVar5.nsec;
  ptime::local_time(&formatted,&local_1d8);
  std::locale::locale((locale *)&local_1f8,
                      (locale *)((long)&alStack_c0[0]._M_impl + *(long *)(_ss + -0x18)));
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     ((locale *)&local_1f8);
  lVar1 = *(long *)((long)alStack_a8 + *(long *)(_ss + -0x18));
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar2,lVar1,lVar1 == 0,&ss + *(long *)(_ss + -0x18),0x20,&formatted,
             "%Y-%m-%d %H:%M:%S; ","");
  std::locale::~locale((locale *)&local_1f8);
  poVar3 = std::operator<<((ostream *)&ss,*(char **)(this + 8));
  poVar3 = std::operator<<(poVar3,", ");
  pcVar4 = logger::level_to_string(*(level_type *)this);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,": ");
  message::log_message_abi_cxx11_(&local_1f8,(message *)this);
  std::operator<<(poVar3,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  poVar3 = std::operator<<((ostream *)&ss," (");
  pcVar4 = message::file_name((message *)this);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)(this + 0x18));
  std::operator<<(poVar3,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string format_plain_text_message(message const &msg)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now();
			std::tm formatted = ptime::local_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S; ";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}